

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.c
# Opt level: O0

_InstInfo * inst_lookup_3dnow(_CodeInfo *ci)

{
  byte bVar1;
  _InstNode in_00;
  long in_RDI;
  int index;
  _InstNode in;
  undefined8 local_8;
  
  in_00 = Table_0F_0F;
  if (*(int *)(in_RDI + 0x20) < 1) {
    local_8 = (_InstInfo *)0x0;
  }
  else {
    bVar1 = **(byte **)(in_RDI + 0x18);
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
    local_8 = inst_get_info(in_00,(uint)bVar1);
  }
  return local_8;
}

Assistant:

_InstInfo* inst_lookup_3dnow(_CodeInfo* ci)
{
	/* Start off from the two escape bytes gates... which is 3DNow! table.*/
	_InstNode in = Table_0F_0F;

	int index;

	/* Make sure we can read a byte off the stream. */
	if (ci->codeLen < 1) return NULL;

	index = *ci->code;

	ci->codeLen -= 1;
	ci->code += 1;
	return inst_get_info(in, index);
}